

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minheap_test.cpp
# Opt level: O1

int main(void)

{
  uint uVar1;
  uint32_t hole_index;
  int iVar2;
  int iVar3;
  event *e;
  int i_1;
  int i;
  long lVar4;
  event *peStack_2038;
  event *inserted [1024];
  MinHeap<event> MinHeap;
  
  inserted[0x3ff] = (event *)0x0;
  MinHeap.m_ptrArr = (event **)0x0;
  lVar4 = 0;
  do {
    e = (event *)malloc(0x18);
    inserted[lVar4 + -1] = e;
    iVar2 = rand();
    (e->ev_timeout).tv_sec = (long)iVar2;
    iVar2 = rand();
    (e->ev_timeout).tv_usec = (long)iVar2;
    hole_index = (uint32_t)MinHeap.m_ptrArr;
    sznet::MinHeap<event>::reserve
              ((MinHeap<event> *)(inserted + 0x3ff),(uint32_t)MinHeap.m_ptrArr + 1);
    uVar1 = (uint32_t)MinHeap.m_ptrArr + 1;
    MinHeap.m_ptrArr = (event **)(ulong)uVar1;
    sznet::MinHeap<event>::shiftUp_((MinHeap<event> *)(inserted + 0x3ff),hole_index,e);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x400);
  sznet::MinHeap<event>::checkHeap((MinHeap<event> *)(inserted + 0x3ff));
  if (uVar1 == 0x400) {
    iVar2 = 0x200;
    do {
      iVar3 = rand();
      if (((uint)(iVar3 % 0x400) < 0x400) &&
         ((inserted[(ulong)(uint)(iVar3 % 0x400) - 1]->super_MinHeaBaseElem).min_heap_idx != -1)) {
        iVar3 = sznet::MinHeap<event>::erase
                          ((MinHeap<event> *)(inserted + 0x3ff),
                           inserted[(ulong)(uint)(iVar3 % 0x400) - 1]);
        if (iVar3 != 0) {
          __assert_fail("rst == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/ds/minheap_test.cpp"
                        ,0x56,"int main()");
        }
        iVar2 = iVar2 + -1;
      }
    } while (0 < iVar2);
    sznet::MinHeap<event>::checkHeap((MinHeap<event> *)(inserted + 0x3ff));
    __assert_fail("MinHeap.size() == 512",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/ds/minheap_test.cpp"
                  ,0x5b,"int main()");
  }
  __assert_fail("MinHeap.size() == 1024",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/ds/minheap_test.cpp"
                ,0x4b,"int main()");
}

Assistant:

int main()
{
	event* inserted[1024];
	MinHeap<event> MinHeap(&event_greater);

	for (int i = 0; i < 1024; ++i)
	{
		inserted[i] = (event*)malloc(sizeof(event));
		set_random_timeout(inserted[i]);
		MinHeap.push(inserted[i]);
	}

	MinHeap.checkHeap();
	assert(MinHeap.size() == 1024);
	// MinHeap.LevelPrint(event_getstr);

	int sum = 512;
	int rst = 0;
	while (sum > 0)
	{
		uint32_t index = rand() % 1024;
		if (index < MinHeap.size() && inserted[index]->min_heap_idx != -1)
		{
			rst = MinHeap.erase(inserted[index]);
			assert(rst == 0);
			--sum;
		}
	}
	MinHeap.checkHeap();
	assert(MinHeap.size() == 512);

	sum = 500;
	event* e = nullptr;
	while (sum > 0)
	{
		e = MinHeap.pop();
		assert(e != nullptr);
		--sum;
	}

	MinHeap.checkHeap();
	assert(MinHeap.size() == 12);
	MinHeap.levelPrint(event_getstr);

	for (int i = 0; i < 1024; ++i)
	{
		free(inserted[i]);
	}

	return 0;
}